

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::gc_full(CVmObjTable *this)

{
  gc_pass_init(this);
  gc_pass_finish(this);
  return;
}

Assistant:

void CVmObjTable::gc_full(VMG0_)
{
    /* count it if in statistics mode */
    IF_GC_STATS(gc_stats.begin_pass());

    /* 
     *   run the initial pass to mark globally-reachable objects, then run
     *   the garbage collector to completion 
     */
    gc_pass_init(vmg0_);
    gc_pass_finish(vmg0_);

    /* count it if in statistics mode */
    IF_GC_STATS(gc_stats.end_pass());
}